

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O2

void XXH3_accumulate_512_sse2(void *acc,void *input,void *secret)

{
  undefined1 auVar1 [16];
  long lVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  for (lVar3 = 0; lVar3 != 0x40; lVar3 = lVar3 + 0x10) {
    auVar1 = *(undefined1 (*) [16])((long)input + lVar3);
    auVar5 = *(undefined1 (*) [16])((long)secret + lVar3) ^ auVar1;
    auVar4._0_8_ = auVar1._8_8_;
    auVar4._8_4_ = auVar1._0_4_;
    auVar4._12_4_ = auVar1._4_4_;
    lVar2 = ((long *)((long)acc + lVar3))[1];
    *(long *)((long)acc + lVar3) =
         auVar4._0_8_ + *(long *)((long)acc + lVar3) + (ulong)auVar5._4_4_ * (ulong)auVar5._0_4_;
    ((long *)((long)acc + lVar3))[1] =
         auVar4._8_8_ + lVar2 + (ulong)auVar5._12_4_ * (ulong)auVar5._8_4_;
  }
  return;
}

Assistant:

XXH_FORCE_INLINE XXH_TARGET_SSE2 void XXH3_accumulate_512_sse2(
    void* XXH_RESTRICT acc, const void* XXH_RESTRICT input,
    const void* XXH_RESTRICT secret) {
  /* SSE2 is just a half-scale version of the AVX2 version. */
  XXH_ASSERT((((size_t)acc) & 15) == 0);
  {
    XXH_ALIGN(16) __m128i* const xacc = (__m128i*)acc;
    /* Unaligned. This is mainly for pointer arithmetic, and because
     * _mm_loadu_si128 requires a const __m128i * pointer for some reason. */
    const __m128i* const xinput = (const __m128i*)input;
    /* Unaligned. This is mainly for pointer arithmetic, and because
     * _mm_loadu_si128 requires a const __m128i * pointer for some reason. */
    const __m128i* const xsecret = (const __m128i*)secret;

    size_t i;
    for (i = 0; i < XXH_STRIPE_LEN / sizeof(__m128i); i++) {
      /* data_vec    = xinput[i]; */
      __m128i const data_vec = _mm_loadu_si128(xinput + i);
      /* key_vec     = xsecret[i]; */
      __m128i const key_vec = _mm_loadu_si128(xsecret + i);
      /* data_key    = data_vec ^ key_vec; */
      __m128i const data_key = _mm_xor_si128(data_vec, key_vec);
      /* data_key_lo = data_key >> 32; */
      __m128i const data_key_lo =
          _mm_shuffle_epi32(data_key, _MM_SHUFFLE(0, 3, 0, 1));
      /* product     = (data_key & 0xffffffff) * (data_key_lo & 0xffffffff); */
      __m128i const product = _mm_mul_epu32(data_key, data_key_lo);
      /* xacc[i] += swap(data_vec); */
      __m128i const data_swap =
          _mm_shuffle_epi32(data_vec, _MM_SHUFFLE(1, 0, 3, 2));
      __m128i const sum = _mm_add_epi64(xacc[i], data_swap);
      /* xacc[i] += product; */
      xacc[i] = _mm_add_epi64(product, sum);
    }
  }
}